

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

void __thiscall
llvm::SMDiagnostic::print
          (SMDiagnostic *this,char *ProgName,raw_ostream *S,bool ShowColors,bool ShowKindLabel)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  raw_ostream *prVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  char *pcVar8;
  char *__last;
  size_t sVar9;
  undefined1 *puVar10;
  long lVar11;
  undefined8 uVar12;
  ulong uVar13;
  bool local_1b1;
  ulong local_138;
  size_t OutCol_1;
  size_t e_2;
  size_t i_1;
  uint OutCol;
  uint e_1;
  uint i;
  undefined8 local_108;
  ArrayRef<char> local_100;
  ArrayRef<llvm::SMFixIt> local_f0;
  undefined1 local_e0 [8];
  string FixItInsertionLine;
  unsigned_long local_b8;
  ulong local_b0;
  value_type local_a4;
  pair<unsigned_int,_unsigned_int> R;
  uint e;
  uint r;
  string CaretLine;
  size_t NumColumns;
  undefined8 local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  byte local_42;
  byte local_41;
  bool ShowKindLabel_local;
  raw_ostream *prStack_40;
  bool ShowColors_local;
  raw_ostream *S_local;
  char *ProgName_local;
  SMDiagnostic *this_local;
  size_t *local_20;
  string *local_18;
  uint *local_10;
  
  local_42 = ShowKindLabel;
  local_41 = ShowColors;
  prStack_40 = S;
  S_local = (raw_ostream *)ProgName;
  ProgName_local = (char *)this;
  iVar2 = (*S->_vptr_raw_ostream[6])();
  local_41 = (local_41 & 1 & (byte)iVar2 & 1) != 0;
  if ((bool)local_41) {
    (*prStack_40->_vptr_raw_ostream[2])(prStack_40,8,1,0);
  }
  if ((S_local != (raw_ostream *)0x0) && (*(char *)&S_local->_vptr_raw_ostream != '\0')) {
    prVar4 = raw_ostream::operator<<(prStack_40,(char *)S_local);
    raw_ostream::operator<<(prVar4,": ");
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar1 = std::operator==(&this->Filename,"-");
    if (bVar1) {
      raw_ostream::operator<<(prStack_40,"<stdin>");
    }
    else {
      raw_ostream::operator<<(prStack_40,&this->Filename);
    }
    if (this->LineNo != -1) {
      prVar4 = raw_ostream::operator<<(prStack_40,':');
      raw_ostream::operator<<(prVar4,this->LineNo);
      if (this->ColumnNo != -1) {
        prVar4 = raw_ostream::operator<<(prStack_40,':');
        raw_ostream::operator<<(prVar4,this->ColumnNo + 1);
      }
    }
    raw_ostream::operator<<(prStack_40,": ");
  }
  if ((local_42 & 1) != 0) {
    switch(this->Kind) {
    case DK_Error:
      if ((local_41 & 1) != 0) {
        (*prStack_40->_vptr_raw_ostream[2])(prStack_40,1,1,0);
      }
      raw_ostream::operator<<(prStack_40,"error: ");
      break;
    case DK_Warning:
      if ((local_41 & 1) != 0) {
        (*prStack_40->_vptr_raw_ostream[2])(prStack_40,5,1,0);
      }
      raw_ostream::operator<<(prStack_40,"warning: ");
      break;
    case DK_Remark:
      if ((local_41 & 1) != 0) {
        (*prStack_40->_vptr_raw_ostream[2])(prStack_40,4,1,0);
      }
      raw_ostream::operator<<(prStack_40,"remark: ");
      break;
    case DK_Note:
      if ((local_41 & 1) != 0) {
        (*prStack_40->_vptr_raw_ostream[2])(prStack_40,0,1);
      }
      raw_ostream::operator<<(prStack_40,"note: ");
    }
    if ((local_41 & 1) != 0) {
      (*prStack_40->_vptr_raw_ostream[3])();
      (*prStack_40->_vptr_raw_ostream[2])(prStack_40,8,1,0);
    }
  }
  prVar4 = raw_ostream::operator<<(prStack_40,&this->Message);
  raw_ostream::operator<<(prVar4,'\n');
  if ((local_41 & 1) != 0) {
    (*prStack_40->_vptr_raw_ostream[3])();
  }
  if ((this->LineNo != -1) && (this->ColumnNo != -1)) {
    local_50._M_current =
         (char *)find_if<std::__cxx11::string_const&,bool(*)(char)>(&this->LineContents,isNonASCII);
    local_58._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
    prVar4 = prStack_40;
    if (bVar1) {
      this_local = (SMDiagnostic *)&this->LineContents;
      local_20 = &NumColumns;
      sVar9 = std::__cxx11::string::data();
      NumColumns = sVar9;
      uVar12 = std::__cxx11::string::length();
      local_60 = uVar12;
      printSourceLine(prVar4,_NumColumns);
    }
    else {
      CaretLine.field_2._8_8_ = std::__cxx11::string::size();
      uVar5 = CaretLine.field_2._8_8_ + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&r,uVar5,' ',(allocator *)((long)&e + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 3));
      R.second = 0;
      sVar6 = std::
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ::size(&this->Ranges);
      R.first = (uint)sVar6;
      for (; R.second != R.first; R.second = R.second + 1) {
        pvVar7 = std::
                 vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->Ranges,(ulong)R.second);
        local_a4 = *pvVar7;
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&r);
        local_b0 = (ulong)local_a4 >> 0x20;
        local_b8 = std::__cxx11::string::size();
        std::min<unsigned_long>(&local_b0,&local_b8);
        __last = (char *)std::__cxx11::string::operator[]((ulong)&r);
        FixItInsertionLine.field_2._M_local_buf[0xf] = '~';
        std::fill<char*,char>(pcVar8,__last,FixItInsertionLine.field_2._M_local_buf + 0xf);
      }
      std::__cxx11::string::string((string *)local_e0);
      ArrayRef<llvm::SMFixIt>::ArrayRef<void>
                (&local_f0,(SmallVectorTemplateCommon<llvm::SMFixIt,_void> *)&this->FixIts);
      pcVar8 = SMLoc::getPointer(&this->Loc);
      iVar2 = this->ColumnNo;
      sVar9 = std::__cxx11::string::size();
      local_100 = makeArrayRef<char>(pcVar8 + -(long)iVar2,sVar9);
      buildFixItLine((string *)&r,(string *)local_e0,local_f0,local_100);
      if ((ulong)CaretLine.field_2._8_8_ < (ulong)(uint)this->ColumnNo) {
        puVar10 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&r);
        *puVar10 = 0x5e;
      }
      else {
        puVar10 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&r);
        *puVar10 = 0x5e;
      }
      lVar11 = std::__cxx11::string::find_last_not_of((char)&r,0x20);
      std::__cxx11::string::erase((ulong)&r,lVar11 + 1);
      prVar4 = prStack_40;
      local_18 = &this->LineContents;
      local_10 = &e_1;
      uVar12 = std::__cxx11::string::data();
      _e_1 = uVar12;
      uVar12 = std::__cxx11::string::length();
      local_108 = uVar12;
      printSourceLine(prVar4,_e_1);
      if ((local_41 & 1) != 0) {
        (*prStack_40->_vptr_raw_ostream[2])(prStack_40,2,1,0);
      }
      OutCol = 0;
      uVar3 = std::__cxx11::string::size();
      i_1._4_4_ = 0;
      for (; OutCol != uVar3; OutCol = OutCol + 1) {
        uVar5 = std::__cxx11::string::size();
        if ((OutCol < uVar5) &&
           (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&this->LineContents),
           *pcVar8 == '\t')) {
          do {
            prVar4 = prStack_40;
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&r);
            raw_ostream::operator<<(prVar4,*pcVar8);
            i_1._4_4_ = i_1._4_4_ + 1;
          } while ((i_1._4_4_ & 7) != 0);
        }
        else {
          prVar4 = prStack_40;
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&r);
          raw_ostream::operator<<(prVar4,*pcVar8);
          i_1._4_4_ = i_1._4_4_ + 1;
        }
      }
      raw_ostream::operator<<(prStack_40,'\n');
      if ((local_41 & 1) != 0) {
        (*prStack_40->_vptr_raw_ostream[3])();
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        e_2 = 0;
        uVar5 = std::__cxx11::string::size();
        local_138 = 0;
        for (; e_2 < uVar5; e_2 = e_2 + 1) {
          uVar13 = std::__cxx11::string::size();
          if ((e_2 < uVar13) &&
             (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&this->LineContents),
             *pcVar8 == '\t')) {
            do {
              prVar4 = prStack_40;
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_e0);
              raw_ostream::operator<<(prVar4,*pcVar8);
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_e0);
              if (*pcVar8 != ' ') {
                e_2 = e_2 + 1;
              }
              local_138 = local_138 + 1;
              local_1b1 = (local_138 & 7) != 0 && e_2 != uVar5;
            } while (local_1b1);
          }
          else {
            prVar4 = prStack_40;
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_e0);
            raw_ostream::operator<<(prVar4,*pcVar8);
            local_138 = local_138 + 1;
          }
        }
        raw_ostream::operator<<(prStack_40,'\n');
      }
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)&r);
    }
  }
  return;
}

Assistant:

void SMDiagnostic::print(const char *ProgName, raw_ostream &S, bool ShowColors,
                         bool ShowKindLabel) const {
  // Display colors only if OS supports colors.
  ShowColors &= S.has_colors();

  if (ShowColors)
    S.changeColor(raw_ostream::SAVEDCOLOR, true);

  if (ProgName && ProgName[0])
    S << ProgName << ": ";

  if (!Filename.empty()) {
    if (Filename == "-")
      S << "<stdin>";
    else
      S << Filename;

    if (LineNo != -1) {
      S << ':' << LineNo;
      if (ColumnNo != -1)
        S << ':' << (ColumnNo+1);
    }
    S << ": ";
  }

  if (ShowKindLabel) {
    switch (Kind) {
    case SourceMgr::DK_Error:
      if (ShowColors)
        S.changeColor(raw_ostream::RED, true);
      S << "error: ";
      break;
    case SourceMgr::DK_Warning:
      if (ShowColors)
        S.changeColor(raw_ostream::MAGENTA, true);
      S << "warning: ";
      break;
    case SourceMgr::DK_Note:
      if (ShowColors)
        S.changeColor(raw_ostream::BLACK, true);
      S << "note: ";
      break;
    case SourceMgr::DK_Remark:
      if (ShowColors)
        S.changeColor(raw_ostream::BLUE, true);
      S << "remark: ";
      break;
    }

    if (ShowColors) {
      S.resetColor();
      S.changeColor(raw_ostream::SAVEDCOLOR, true);
    }
  }

  S << Message << '\n';

  if (ShowColors)
    S.resetColor();

  if (LineNo == -1 || ColumnNo == -1)
    return;

  // FIXME: If there are multibyte or multi-column characters in the source, all
  // our ranges will be wrong. To do this properly, we'll need a byte-to-column
  // map like Clang's TextDiagnostic. For now, we'll just handle tabs by
  // expanding them later, and bail out rather than show incorrect ranges and
  // misaligned fixits for any other odd characters.
  if (find_if(LineContents, isNonASCII) != LineContents.end()) {
    printSourceLine(S, LineContents);
    return;
  }
  size_t NumColumns = LineContents.size();

  // Build the line with the caret and ranges.
  std::string CaretLine(NumColumns+1, ' ');

  // Expand any ranges.
  for (unsigned r = 0, e = Ranges.size(); r != e; ++r) {
    std::pair<unsigned, unsigned> R = Ranges[r];
    std::fill(&CaretLine[R.first],
              &CaretLine[std::min((size_t)R.second, CaretLine.size())],
              '~');
  }

  // Add any fix-its.
  // FIXME: Find the beginning of the line properly for multibyte characters.
  std::string FixItInsertionLine;
  buildFixItLine(CaretLine, FixItInsertionLine, FixIts,
                 makeArrayRef(Loc.getPointer() - ColumnNo,
                              LineContents.size()));

  // Finally, plop on the caret.
  if (unsigned(ColumnNo) <= NumColumns)
    CaretLine[ColumnNo] = '^';
  else
    CaretLine[NumColumns] = '^';

  // ... and remove trailing whitespace so the output doesn't wrap for it.  We
  // know that the line isn't completely empty because it has the caret in it at
  // least.
  CaretLine.erase(CaretLine.find_last_not_of(' ')+1);

  printSourceLine(S, LineContents);

  if (ShowColors)
    S.changeColor(raw_ostream::GREEN, true);

  // Print out the caret line, matching tabs in the source line.
  for (unsigned i = 0, e = CaretLine.size(), OutCol = 0; i != e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      S << CaretLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      S << CaretLine[i];
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';

  if (ShowColors)
    S.resetColor();

  // Print out the replacement line, matching tabs in the source line.
  if (FixItInsertionLine.empty())
    return;

  for (size_t i = 0, e = FixItInsertionLine.size(), OutCol = 0; i < e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      S << FixItInsertionLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      S << FixItInsertionLine[i];
      // FIXME: This is trying not to break up replacements, but then to re-sync
      // with the tabs between replacements. This will fail, though, if two
      // fix-it replacements are exactly adjacent, or if a fix-it contains a
      // space. Really we should be precomputing column widths, which we'll
      // need anyway for multibyte chars.
      if (FixItInsertionLine[i] != ' ')
        ++i;
      ++OutCol;
    } while (((OutCol % TabStop) != 0) && i != e);
  }
  S << '\n';
}